

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O3

string * __thiscall
benchmark::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,benchmark *this,char *flag)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *extraout_RAX;
  string *psVar2;
  long lVar3;
  string env_var;
  string flag_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40;
  long local_38;
  
  std::__cxx11::string::string((string *)&local_40,(char *)this,(allocator *)&local_60);
  paVar1 = &local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)paVar1;
  if (local_38 != 0) {
    lVar3 = 0;
    do {
      toupper((int)*(char *)((long)&(local_40->_M_dataplus)._M_p + lVar3));
      std::__cxx11::string::push_back((char)&local_60);
      lVar3 = lVar3 + 1;
    } while (lVar3 != local_38);
  }
  std::operator+(__return_storage_ptr__,"BENCHMARK_",&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  psVar2 = (string *)&stack0xffffffffffffffd0;
  if (local_40 != psVar2) {
    operator_delete(local_40);
    psVar2 = extraout_RAX;
  }
  return psVar2;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string flag_str(flag);

  std::string env_var;
  for (size_t i = 0; i != flag_str.length(); ++i)
    env_var += static_cast<char>(::toupper(flag_str.c_str()[i]));

  return "BENCHMARK_" + env_var;
}